

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_conv.cpp
# Opt level: O2

ImageVolume * __thiscall
LayerConv::mat2img(ImageVolume *__return_storage_ptr__,LayerConv *this,MatrixXd *conv_mat,
                  LayerSize *output_size)

{
  long cols;
  long rows;
  long lVar1;
  long startCol;
  long blockRows;
  Image output_img;
  MatrixXd img_channel;
  DenseBase<Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>
  local_68 [56];
  
  cols = output_size->rows;
  rows = output_size->cols;
  blockRows = rows * cols;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (lVar1 = 0; lVar1 = (long)(int)lVar1,
      lVar1 < (conv_mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
              .m_rows; lVar1 = lVar1 + blockRows) {
    output_img.
    super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    output_img.
    super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    output_img.
    super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (startCol = 0;
        startCol <
        (conv_mat->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
        m_cols; startCol = startCol + 1) {
      Eigen::Block<const_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>::Block
                ((Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *)local_68,
                 conv_mat,lVar1,startCol,blockRows,1);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,_1,_1,false>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&img_channel,local_68);
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
                ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&img_channel,rows,
                 cols);
      Eigen::internal::
      inplace_transpose_selector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_false,_false>::run
                ((Matrix<double,__1,__1,_0,__1,__1> *)&img_channel);
      std::
      vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::push_back(&output_img,(value_type *)&img_channel);
      free(img_channel.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
    }
    std::
    vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
    ::push_back(__return_storage_ptr__,&output_img);
    std::
    vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
    ::~vector(&output_img);
  }
  return __return_storage_ptr__;
}

Assistant:

ImageVolume LayerConv::mat2img(const Eigen::MatrixXd& conv_mat, const LayerSize& output_size) {
	auto rows = output_size.rows;
	auto cols = output_size.cols;
	auto opt_img_sz = rows * cols; // output image size.

	ImageVolume output_volume;
	for (auto img_ind = 0; img_ind < conv_mat.rows(); img_ind += opt_img_sz) {
		Image output_img;
		for (auto c = 0; c < conv_mat.cols(); c++) {
			MatrixXd img_channel = conv_mat.block(img_ind, c, opt_img_sz, 1);
			img_channel.resize(cols, rows);
			img_channel.transposeInPlace();

			output_img.push_back(img_channel);
		}

		output_volume.push_back(output_img);
	}
	
	return output_volume;
}